

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkDiagJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  ErrorCode EVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  Value *pVVar6;
  _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
  *p_Var7;
  _Base_ptr p_Var8;
  char *pcVar9;
  char *pcVar10;
  NetDiagData *aNetDiagData;
  NetDiagData *aNetDiagData_00;
  NetDiagData *aNetDiagData_01;
  string *this_00;
  pointer pbVar11;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_3a0;
  Value local_380;
  DiagAnsDataMap diagAnsDataMaps;
  string dstAddr;
  string local_2d8;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [40];
  Error local_250;
  undefined1 local_228 [40];
  undefined1 local_200 [40];
  NetDiagData diagData;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  dstAddr._M_dataplus._M_p = (pointer)&dstAddr.field_2;
  dstAddr._M_string_length = 0;
  dstAddr.field_2._M_local_buf[0] = '\0';
  diagData.mMode.mIsRxOnWhenIdleMode = false;
  diagData.mMode.mIsMtd = false;
  diagData.mMode.mIsStableNetworkDataRequired = false;
  diagData.mRoute64.mIdSequence = '\0';
  diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mMacAddr = 0;
  diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mRoute64.mMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mRoute64.mRouteData.
  super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mLeaderData.mPartitionId = 0;
  diagData.mLeaderData.mWeighting = '\0';
  diagData.mLeaderData.mDataVersion = '\0';
  diagData.mLeaderData.mStableDataVersion = '\0';
  diagData.mLeaderData.mRouterId = '\0';
  diagData.mMacCounters.mIfInUnknownProtos = 0;
  diagData.mMacCounters.mIfInErrors = 0;
  diagData.mMacCounters.mIfOutErrors = 0;
  diagData.mMacCounters.mIfInUcastPkts = 0;
  diagData.mMacCounters.mIfInBroadcastPkts = 0;
  diagData.mMacCounters.mIfInDiscards = 0;
  diagData.mMacCounters.mIfOutUcastPkts = 0;
  diagData.mMacCounters.mIfOutBroadcastPkts = 0;
  diagData.mMacCounters.mIfOutDiscards = 0;
  diagData.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mChildTable.
  super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  diagData.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  diagData.mChildIpv6AddrsInfoList.
  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  diagData.mPresentFlags = 0;
  pbVar11 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
  if (uVar5 < 0x41) {
    diagAnsDataMaps._M_t._M_impl._0_8_ = 0xc0000000c;
    diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_3db71;
    diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x7;
    diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x200000000;
    diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)::fmt::v10::detail::
                 parse_format_specs<char[18],fmt::v10::detail::compile_parse_context<char>>;
    pcVar10 = "{} \n {}";
    diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)&diagAnsDataMaps;
    while (pcVar9 = pcVar10, pcVar9 != "") {
      pcVar10 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar10 == "") || (*pcVar10 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar10 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[18],char[62]>&>
                            (pcVar9,"",
                             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&diagAnsDataMaps);
      }
    }
    diagAnsDataMaps._M_t._M_impl._0_8_ = anon_var_dwarf_3771e;
    diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)anon_var_dwarf_3772b;
    fmt.size_ = 0xcc;
    fmt.data_ = (char *)0x7;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&diagAnsDataMaps;
    ::fmt::v10::vformat_abi_cxx11_(&local_3a0,(v10 *)"{} \n {}",fmt,args);
    this_00 = (string *)(local_58 + 8);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(this_00,(string *)&local_3a0);
    Value::Value(&local_380,(Error *)local_58);
LAB_00129c93:
    Value::operator=(__return_storage_ptr__,&local_380);
    Value::~Value(&local_380);
    std::__cxx11::string::~string(this_00);
    this_01 = &local_3a0;
  }
  else {
    if ((uVar5 == 0x60) || (pbVar11[3]._M_string_length == 0)) {
      dstAddr._M_string_length = 0;
      dstAddr.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_assign((string *)&dstAddr);
      pbVar11 = (aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    std::__cxx11::string::string((string *)&local_380,"query",(allocator *)&diagAnsDataMaps);
    bVar3 = CaseInsensitiveEqual(pbVar11 + 1,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    if (!bVar3) {
      pbVar11 = (aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&local_380,"reset",(allocator *)&diagAnsDataMaps);
      bVar4 = CaseInsensitiveEqual(pbVar11 + 1,(string *)&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      if (!bVar4) {
        diagAnsDataMaps._M_t._M_impl._0_4_ = 0xd;
        diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = anon_var_dwarf_3ce11;
        diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x1f;
        diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)0x100000000;
        diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar10 = "\'{}\' is not a valid sub-command";
        diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)&diagAnsDataMaps;
        while (pcVar9 = pcVar10, pcVar9 != "") {
          pcVar10 = pcVar9 + 1;
          if (*pcVar9 == '}') {
            if ((pcVar10 == "") || (*pcVar10 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar10 = pcVar9 + 2;
          }
          else if (*pcVar9 == '{') {
            pcVar10 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar9,"",(format_string_checker<char> *)&diagAnsDataMaps);
          }
        }
        pbVar11 = (aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        diagAnsDataMaps._M_t._M_impl._0_8_ = pbVar11[1]._M_dataplus._M_p;
        diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             pbVar11[1]._M_string_length;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x1f;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&diagAnsDataMaps;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_3a0,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_00);
        this_00 = (string *)(local_80 + 8);
        local_80._0_4_ = kInvalidCommand;
        std::__cxx11::string::string(this_00,(string *)&local_3a0);
        Value::Value(&local_380,(Error *)local_80);
        goto LAB_00129c93;
      }
    }
    pbVar11 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_380,"extaddr",(allocator *)&diagAnsDataMaps);
    bVar4 = CaseInsensitiveEqual(pbVar11 + 2,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    if (bVar4 && bVar3) {
      peVar2 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
                (local_200,peVar2,&dstAddr,1);
      Value::Value(&local_380,(Error *)local_200);
      pVVar6 = Value::operator=(__return_storage_ptr__,&local_380);
      EVar1 = (pVVar6->mError).mCode;
      Value::~Value(&local_380);
      std::__cxx11::string::~string((string *)(local_200 + 8));
      if (EVar1 != kNone) goto LAB_00129cbd;
      local_380.mError.mCode = 1000;
      local_380.mError._4_4_ = 0;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_380);
      diagData.mPresentFlags = 1;
      p_Var7 = &CommissionerApp::GetNetDiagTlvs
                          ((aCommissioner->
                           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->_M_t;
      std::
      _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
      ::_Rb_tree(&diagAnsDataMaps._M_t,p_Var7);
      for (p_Var8 = diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        Address::ToString_abi_cxx11_(&local_2b8,(Address *)(p_Var8 + 1));
        std::operator+(&local_298,"Peer Address: ",&local_2b8);
        std::operator+(&local_3a0,&local_298,"\nContent: ");
        NetDiagDataToJson_abi_cxx11_(&local_2d8,(commissioner *)&p_Var8[1]._M_right,aNetDiagData);
        std::operator+(&local_a0,&local_3a0,&local_2d8);
        Value::Value(&local_380,&local_a0);
        Value::operator=(__return_storage_ptr__,&local_380);
        Value::~Value(&local_380);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
      }
      std::
      _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
      ::~_Rb_tree(&diagAnsDataMaps._M_t);
    }
    pbVar11 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_380,"rloc16",(allocator *)&diagAnsDataMaps);
    bVar4 = CaseInsensitiveEqual(pbVar11 + 2,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    if (bVar4 && bVar3) {
      peVar2 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
                (local_228,peVar2,&dstAddr,2);
      Value::Value(&local_380,(Error *)local_228);
      pVVar6 = Value::operator=(__return_storage_ptr__,&local_380);
      EVar1 = (pVVar6->mError).mCode;
      Value::~Value(&local_380);
      std::__cxx11::string::~string((string *)(local_228 + 8));
      if (EVar1 != kNone) goto LAB_00129cbd;
      local_380.mError.mCode = 1000;
      local_380.mError._4_4_ = 0;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_380);
      diagData.mPresentFlags = 2;
      p_Var7 = &CommissionerApp::GetNetDiagTlvs
                          ((aCommissioner->
                           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->_M_t;
      std::
      _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
      ::_Rb_tree(&diagAnsDataMaps._M_t,p_Var7);
      for (p_Var8 = diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        Address::ToString_abi_cxx11_(&local_2b8,(Address *)(p_Var8 + 1));
        std::operator+(&local_298,"Peer Address: ",&local_2b8);
        std::operator+(&local_3a0,&local_298,"\nContent: ");
        NetDiagDataToJson_abi_cxx11_(&local_2d8,(commissioner *)&p_Var8[1]._M_right,aNetDiagData_00)
        ;
        std::operator+(&local_c0,&local_3a0,&local_2d8);
        Value::Value(&local_380,&local_c0);
        Value::operator=(__return_storage_ptr__,&local_380);
        Value::~Value(&local_380);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
      }
      std::
      _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
      ::~_Rb_tree(&diagAnsDataMaps._M_t);
    }
    pbVar11 = (aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&local_380,"maccounters",(allocator *)&diagAnsDataMaps);
    bVar4 = CaseInsensitiveEqual(pbVar11 + 2,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    if (!bVar4) goto LAB_00129cbd;
    if (bVar3) {
      peVar2 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x35])
                (local_278,peVar2,&dstAddr,0x100);
      Value::Value(&local_380,(Error *)local_278);
      pVVar6 = Value::operator=(__return_storage_ptr__,&local_380);
      EVar1 = (pVVar6->mError).mCode;
      Value::~Value(&local_380);
      std::__cxx11::string::~string((string *)(local_278 + 8));
      if (EVar1 == kNone) {
        local_380.mError.mCode = 1000;
        local_380.mError._4_4_ = 0;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&local_380);
        diagData.mPresentFlags = 0x100;
        p_Var7 = &CommissionerApp::GetNetDiagTlvs
                            ((aCommissioner->
                             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->_M_t;
        std::
        _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::_Rb_tree(&diagAnsDataMaps._M_t,p_Var7);
        for (p_Var8 = diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != &diagAnsDataMaps._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
          Address::ToString_abi_cxx11_(&local_2b8,(Address *)(p_Var8 + 1));
          std::operator+(&local_298,"Peer Address: ",&local_2b8);
          std::operator+(&local_3a0,&local_298,"\nContent: ");
          NetDiagDataToJson_abi_cxx11_
                    (&local_2d8,(commissioner *)&p_Var8[1]._M_right,aNetDiagData_01);
          std::operator+(&local_e0,&local_3a0,&local_2d8);
          Value::Value(&local_380,&local_e0);
          Value::operator=(__return_storage_ptr__,&local_380);
          Value::~Value(&local_380);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_298);
          std::__cxx11::string::~string((string *)&local_2b8);
        }
        std::
        _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::NetDiagData>_>_>
        ::~_Rb_tree(&diagAnsDataMaps._M_t);
      }
      goto LAB_00129cbd;
    }
    peVar2 = (aCommissioner->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x36])
              (&local_250,peVar2,&dstAddr,0x100);
    Value::Value(&local_380,&local_250);
    Value::operator=(__return_storage_ptr__,&local_380);
    Value::~Value(&local_380);
    this_01 = &local_250.mMessage;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00129cbd:
  NetDiagData::~NetDiagData(&diagData);
  std::__cxx11::string::~string((string *)&dstAddr);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkDiagJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value       value;
    uint64_t    flags         = 0;
    uint8_t     operationType = 0;
    std::string dstAddr;
    NetDiagData diagData;

    VerifyOrExit(aExpr.size() >= 3,
                 value = ERROR_INVALID_ARGS("{} \n {}", SYNTAX_FEW_ARGS,
                                            "netdiag [query] [extaddr | rloc16 ] <dest mesh local address>"));
    if (aExpr.size() > 3 && !aExpr[3].empty())
    {
        dstAddr = aExpr[3];
    }
    else
    {
        dstAddr.clear();
    }

    if (CaseInsensitiveEqual(aExpr[1], "query"))
    {
        operationType = DIAG_GET_QRY_TYPE;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "reset"))
    {
        operationType = DIAG_RST_NTF_TYPE;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (CaseInsensitiveEqual(aExpr[2], "extaddr"))
    {
        flags = NetDiagData::kExtMacAddrBit;
        if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }
    if (CaseInsensitiveEqual(aExpr[2], "rloc16"))
    {
        flags = NetDiagData::kMacAddrBit;
        if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }
    if (CaseInsensitiveEqual(aExpr[2], "maccounters"))
    {
        flags = NetDiagData::kMacCountersBit;
        if (operationType == DIAG_RST_NTF_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagReset(dstAddr, flags));
        }
        else if (operationType == DIAG_GET_QRY_TYPE)
        {
            SuccessOrExit(value = aCommissioner->CommandDiagGetQuery(dstAddr, flags));
            std::this_thread::sleep_for(std::chrono::milliseconds(1000));
            diagData.mPresentFlags         = flags;
            DiagAnsDataMap diagAnsDataMaps = aCommissioner->GetNetDiagTlvs();
            for (auto &diagAnsDataMap : diagAnsDataMaps)
            {
                value = "Peer Address: " + (diagAnsDataMap.first).ToString() +
                        "\nContent: " + NetDiagDataToJson(diagAnsDataMap.second);
            }
        }
    }

exit:
    return value;
}